

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O3

REF_STATUS ref_adj_min_degree_node(REF_ADJ ref_adj,REF_INT *min_degree,REF_INT *min_degree_node)

{
  REF_INT *pRVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  
  *min_degree = -1;
  *min_degree_node = -1;
  iVar2 = ref_adj->nnode;
  if (0 < iVar2) {
    pRVar1 = ref_adj->first;
    lVar3 = 0;
    do {
      iVar5 = pRVar1[lVar3];
      if (iVar5 != -1) {
        iVar4 = 0;
        do {
          iVar4 = iVar4 + 1;
          iVar5 = ref_adj->item[iVar5].next;
        } while (iVar5 != -1);
        if ((*min_degree_node == -1) || (iVar4 < *min_degree)) {
          *min_degree_node = (REF_INT)lVar3;
          *min_degree = iVar4;
          iVar2 = ref_adj->nnode;
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar2);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_adj_min_degree_node(REF_ADJ ref_adj, REF_INT *min_degree,
                                           REF_INT *min_degree_node) {
  REF_INT node, degree;
  *min_degree = REF_EMPTY;
  *min_degree_node = REF_EMPTY;

  for (node = 0; node < ref_adj_nnode(ref_adj); node++) {
    RSS(ref_adj_degree(ref_adj, node, &degree), "deg");
    if (degree > 0) {
      if (REF_EMPTY == (*min_degree_node) || degree < (*min_degree)) {
        *min_degree_node = node;
        *min_degree = degree;
      }
    }
  }

  return REF_SUCCESS;
}